

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector3D.cpp
# Opt level: O0

ostream * CMU462::operator<<(ostream *os,Vector3D *v)

{
  ostream *poVar1;
  double *in_RSI;
  ostream *in_RDI;
  
  poVar1 = std::operator<<(in_RDI,"(");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*in_RSI);
  poVar1 = std::operator<<(poVar1,",");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RSI[1]);
  poVar1 = std::operator<<(poVar1,",");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RSI[2]);
  std::operator<<(poVar1,")");
  return in_RDI;
}

Assistant:

std::ostream& operator<<( std::ostream& os, const Vector3D& v ) {
    os << "(" << v.x << "," << v.y << "," << v.z << ")";
    return os;
  }